

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

void __thiscall
rangeless::tsv::to_num::throw_if<unsigned_int>(to_num *this,bool cond,uint *param_2,char *message)

{
  char *pcVar1;
  char *pcVar2;
  domain_error *this_00;
  allocator local_109;
  string local_108 [32];
  char local_e8 [32];
  X local_c8 [8];
  X local_a8 [8];
  X local_88 [8];
  X local_68 [8];
  X local_48 [8];
  char *local_28;
  char *message_local;
  uint *param_2_local;
  to_num *ptStack_10;
  bool cond_local;
  to_num *this_local;
  
  if (cond) {
    local_28 = message;
    message_local = (char *)param_2;
    param_2_local._7_1_ = cond;
    ptStack_10 = this;
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    pcVar1 = this->m_beg;
    pcVar2 = this->m_end;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,pcVar1,(long)pcVar2 - (long)pcVar1,&local_109);
    std::operator+(local_e8,(X *)"Can\'t parse \'");
    std::operator+(local_c8,local_e8);
    std::type_info::name((type_info *)&unsigned_int::typeinfo);
    std::operator+(local_a8,(char *)local_c8);
    std::operator+(local_88,(char *)local_a8);
    std::operator+(local_68,(char *)local_88);
    std::operator+(local_48,(char *)local_68);
    std::domain_error::domain_error(this_00,(string *)local_48);
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  return;
}

Assistant:

void throw_if(bool cond, const T&, const char* message) const
        {
            if(cond) {
                throw std::domain_error(
                    "Can't parse '" 
                  + std::string(m_beg, size_t(m_end-m_beg))
                  + "' as numeric type '" + typeid(T).name() 
                  + "' - " + message + ".");
            }
        }